

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,int *param_data,int *_woffset,int *_hoffset,int *_doffset,
          int *_coffset,int *_outw,int *_outh,int *_outd,int *_outc)

{
  int iVar1;
  int dims;
  int *_doffset_local;
  int *_hoffset_local;
  int *_woffset_local;
  int *param_data_local;
  Mat *bottom_blob_local;
  Crop *this_local;
  
  iVar1 = bottom_blob->dims;
  if (iVar1 == 1) {
    *_woffset = *param_data;
    *_outw = param_data[3];
  }
  if (iVar1 == 2) {
    *_woffset = *param_data;
    *_hoffset = param_data[1];
    *_outw = param_data[3];
    *_outh = param_data[4];
  }
  if (iVar1 == 3) {
    *_woffset = *param_data;
    *_hoffset = param_data[1];
    *_coffset = param_data[2];
    *_outw = param_data[3];
    *_outh = param_data[4];
    *_outc = param_data[5];
  }
  if (iVar1 == 4) {
    *_woffset = *param_data;
    *_hoffset = param_data[1];
    *_doffset = param_data[2];
    *_coffset = param_data[3];
    *_outw = param_data[4];
    *_outh = param_data[5];
    *_outd = param_data[6];
    *_outc = param_data[7];
  }
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, const int* param_data, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        _woffset = param_data[0];
        _outw = param_data[3];
    }
    if (dims == 2)
    {
        _woffset = param_data[0];
        _hoffset = param_data[1];
        _outw = param_data[3];
        _outh = param_data[4];
    }
    if (dims == 3)
    {
        _woffset = param_data[0];
        _hoffset = param_data[1];
        _coffset = param_data[2];
        _outw = param_data[3];
        _outh = param_data[4];
        _outc = param_data[5];
    }
    if (dims == 4)
    {
        _woffset = param_data[0];
        _hoffset = param_data[1];
        _doffset = param_data[2];
        _coffset = param_data[3];
        _outw = param_data[4];
        _outh = param_data[5];
        _outd = param_data[6];
        _outc = param_data[7];
    }
}